

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_fanout_tree.h
# Opt level: O3

double alex::fanout_tree::merge_nodes_upwards<int,int>
                 (int start_level,double best_cost,int num_keys,int total_keys,
                 vector<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                 *fanout_tree)

{
  int iVar1;
  pointer pvVar2;
  pointer pvVar3;
  bool bVar4;
  double dVar5;
  byte bVar6;
  ulong uVar7;
  int level;
  uint uVar8;
  long lVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  if (0 < start_level) {
    uVar7 = (ulong)(uint)start_level;
    do {
      uVar8 = 1 << ((uint)uVar7 & 0x1f);
      if ((int)uVar8 < 2) {
        return best_cost;
      }
      lVar9 = 0;
      bVar6 = 0;
      pvVar2 = fanout_tree[uVar7].
               super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        if ((*(char *)((long)&pvVar2[1].
                              super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                              ._M_impl.super__Vector_impl_data + lVar9 * 2) == '\x01') &&
           (*(char *)((long)&pvVar2[4].
                             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                             ._M_impl.super__Vector_impl_data + lVar9 * 2) == '\x01')) {
          pvVar3 = fanout_tree[uVar7 - 1].
                   super__Vector_base<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>,_std::allocator<std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar1 = *(int *)((long)&pvVar3[2].
                                  super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                                  ._M_impl.super__Vector_impl_data + lVar9 + 0x10);
          if (iVar1 == 0) {
            *(undefined1 *)
             ((long)&pvVar2[1].
                     super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                     ._M_impl.super__Vector_impl_data + lVar9 * 2) = 0;
            *(undefined1 *)
             ((long)&pvVar2[4].
                     super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                     ._M_impl.super__Vector_impl_data + lVar9 * 2) = 0;
            *(undefined1 *)
             ((long)&pvVar3[1].
                     super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                     ._M_impl.super__Vector_impl_data + lVar9) = 1;
            dVar5 = (double)total_keys * 9.999999999999999e-05;
          }
          else {
            auVar12._8_8_ = 0;
            auVar12._0_8_ =
                 *(ulong *)((long)&(pvVar2->
                                   super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                                   )._M_impl.super__Vector_impl_data + lVar9 * 2 + 8);
            dVar10 = (double)iVar1;
            auVar13 = vmovhpd_avx(auVar12,*(undefined8 *)
                                           ((long)&pvVar2[3].
                                                                                                      
                                                  super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                                                  ._M_impl.super__Vector_impl_data + lVar9 * 2 + 8))
            ;
            auVar12 = vpinsrd_avx(ZEXT416(*(uint *)((long)&pvVar2[2].
                                                                                                                      
                                                  super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                                                  ._M_impl.super__Vector_impl_data +
                                                  lVar9 * 2 + 0x10)),
                                  *(undefined4 *)
                                   ((long)&pvVar2[5].
                                           super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                                           ._M_impl.super__Vector_impl_data + lVar9 * 2 + 0x10),1);
            auVar12 = vcvtdq2pd_avx(auVar12);
            auVar11._0_8_ = auVar13._0_8_ * auVar12._0_8_;
            auVar11._8_8_ = auVar13._8_8_ * auVar12._8_8_;
            auVar13._8_8_ = dVar10;
            auVar13._0_8_ = dVar10;
            auVar12 = vdivpd_avx(auVar11,auVar13);
            dVar5 = ((double)total_keys * 9.999999999999999e-05) / dVar10 +
                    ((auVar12._0_8_ + auVar12._8_8_) -
                    *(double *)
                     ((long)&(pvVar3->
                             super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                             )._M_impl.super__Vector_impl_data + lVar9 + 8));
            if (dVar5 < 0.0) goto LAB_00102c6b;
            *(undefined1 *)
             ((long)&pvVar2[1].
                     super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                     ._M_impl.super__Vector_impl_data + lVar9 * 2) = 0;
            *(undefined1 *)
             ((long)&pvVar2[4].
                     super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                     ._M_impl.super__Vector_impl_data + lVar9 * 2) = 0;
            *(undefined1 *)
             ((long)&pvVar3[1].
                     super__Vector_base<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                     ._M_impl.super__Vector_impl_data + lVar9) = 1;
            dVar5 = dVar5 * dVar10;
          }
          best_cost = best_cost - dVar5 / (double)num_keys;
          bVar6 = 1;
        }
LAB_00102c6b:
        lVar9 = lVar9 + 0x48;
      } while ((ulong)(uVar8 >> 1) * 0x48 != lVar9);
      bVar4 = 1 < (long)uVar7;
      uVar7 = uVar7 - 1;
    } while ((bool)(bVar6 & bVar4));
  }
  return best_cost;
}

Assistant:

static double merge_nodes_upwards(
    int start_level, double best_cost, int num_keys, int total_keys,
    std::vector<std::vector<FTNode>>& fanout_tree) {
  for (int level = start_level; level >= 1; level--) {
    int level_fanout = 1 << level;
    bool at_least_one_merge = false;
    for (int i = 0; i < level_fanout / 2; i++) {
      if (fanout_tree[level][2 * i].use && fanout_tree[level][2 * i + 1].use) {
        int num_node_keys = fanout_tree[level - 1][i].num_keys;
        if (num_node_keys == 0) {
          fanout_tree[level][2 * i].use = false;
          fanout_tree[level][2 * i + 1].use = false;
          fanout_tree[level - 1][i].use = true;
          at_least_one_merge = true;
          best_cost -= kModelSizeWeight * sizeof(AlexDataNode<T, P>) *
                       total_keys / num_keys;
          continue;
        }
        int num_left_keys = fanout_tree[level][2 * i].num_keys;
        int num_right_keys = fanout_tree[level][2 * i + 1].num_keys;
        double merging_cost_saving =
            (fanout_tree[level][2 * i].cost * num_left_keys / num_node_keys) +
            (fanout_tree[level][2 * i + 1].cost * num_right_keys /
             num_node_keys) -
            fanout_tree[level - 1][i].cost +
            (kModelSizeWeight * sizeof(AlexDataNode<T, P>) * total_keys /
             num_node_keys);
        if (merging_cost_saving >= 0) {
          fanout_tree[level][2 * i].use = false;
          fanout_tree[level][2 * i + 1].use = false;
          fanout_tree[level - 1][i].use = true;
          best_cost -= merging_cost_saving * num_node_keys / num_keys;
          at_least_one_merge = true;
        }
      }
    }
    if (!at_least_one_merge) {
      break;
    }
  }
  return best_cost;
}